

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void const_array_suite::pop_front(void)

{
  size_type *begin;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_109;
  int local_108 [2];
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> expect_1;
  value_type local_d0 [2];
  int *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  iterator local_b8;
  iterator local_a8;
  allocator<int> local_85;
  int local_84 [3];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> expect;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<const_int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0x160000000b;
  array[0] = 0x21;
  array[1] = 0;
  begin = &span.member.next;
  vista::circular_view<int_const,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int_const,18446744073709551615ul> *)local_38,(int *)begin,array + 1,
             (int *)begin,3);
  local_48[0] = vista::circular_view<const_int,_18446744073709551615UL>::capacity
                          ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7fd,"void const_array_suite::pop_front()",local_48,
             (undefined1 *)
             ((long)&expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  local_84[0] = 0xb;
  local_84[1] = 0x16;
  local_84[2] = 0x21;
  local_78 = local_84;
  local_70 = 3;
  std::allocator<int>::allocator(&local_85);
  __l_00._M_len = local_70;
  __l_00._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_00,&local_85);
  std::allocator<int>::~allocator(&local_85);
  local_a8 = vista::circular_view<const_int,_18446744073709551615UL>::begin
                       ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  local_b8 = vista::circular_view<const_int,_18446744073709551615UL>::end
                       ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  local_c0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_68);
  local_c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_68);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x801,"void const_array_suite::pop_front()",local_a8,local_b8,local_c0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  local_d0[0] = vista::circular_view<const_int,_18446744073709551615UL>::pop_front
                          ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x803,"void const_array_suite::pop_front()",local_d0,
             (undefined1 *)
             ((long)&expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  local_108[0] = 0x16;
  local_108[1] = 0x21;
  local_100 = local_108;
  local_f8 = 2;
  std::allocator<int>::allocator(&local_109);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,__l,&local_109);
  std::allocator<int>::~allocator(&local_109);
  first_begin = vista::circular_view<const_int,_18446744073709551615UL>::begin
                          ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  first_end = vista::circular_view<const_int,_18446744073709551615UL>::end
                        ((circular_view<const_int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_f0);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_f0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x807,"void const_array_suite::pop_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
  return;
}

Assistant:

void pop_front()
{
    int array[4] = { 11, 22, 33 };
    circular_view<const int> span(&array[0], &array[3],
                                   &array[0], 3);
    BOOST_TEST_EQ(span.capacity(), 3);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_front(), 11);
    {
        std::vector<int> expect = { 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}